

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::UnknownField::SerializeLengthDelimitedNoTagToArray
          (UnknownField *this,uint8 *target)

{
  UnknownFieldSet *pUVar1;
  bool bVar2;
  LogMessage *other;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->type_ != 3) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x14c);
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type()): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  pUVar1 = (this->data_).group_;
  uVar5 = *(uint *)&pUVar1[1].fields_;
  uVar4 = uVar5;
  if (0x7f < uVar5) {
    do {
      *target = (byte)uVar5 | 0x80;
      uVar4 = uVar5 >> 7;
      target = target + 1;
      bVar2 = 0x3fff < uVar5;
      uVar5 = uVar4;
    } while (bVar2);
  }
  *target = (byte)uVar4;
  puVar3 = io::CodedOutputStream::WriteRawToArray
                     (pUVar1->fields_,*(int *)&pUVar1[1].fields_,target + 1);
  return puVar3;
}

Assistant:

uint8* UnknownField::SerializeLengthDelimitedNoTagToArray(uint8* target) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const string& data = *data_.length_delimited_.string_value_;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = io::CodedOutputStream::WriteStringToArray(data, target);
  return target;
}